

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::short_filename_formatter<spdlog::details::null_scoped_padder>::format
          (short_filename_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_3,memory_buf_t *dest)

{
  bool bVar1;
  memory_buf_t *dest_00;
  size_t sVar2;
  memory_buf_t *in_RCX;
  long in_RSI;
  long in_RDI;
  null_scoped_padder p;
  size_t text_size;
  char *filename;
  null_scoped_padder p_1;
  size_t local_70;
  string_view_t in_stack_ffffffffffffffa8;
  null_scoped_padder local_31;
  memory_buf_t *local_30;
  long local_20;
  memory_buf_t *local_10;
  undefined1 *local_8;
  
  local_30 = in_RCX;
  local_20 = in_RSI;
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    null_scoped_padder::null_scoped_padder(&local_31,0,(padding_info *)(in_RDI + 8),local_30);
  }
  else {
    dest_00 = (memory_buf_t *)basename(*(char **)(local_20 + 0x38));
    bVar1 = padding_info::enabled((padding_info *)(in_RDI + 8));
    if (bVar1) {
      local_70 = std::char_traits<char>::length((char_type *)0x21b008);
    }
    else {
      local_70 = 0;
    }
    null_scoped_padder::null_scoped_padder
              ((null_scoped_padder *)&stack0xffffffffffffffb7,local_70,(padding_info *)(in_RDI + 8),
               local_30);
    local_8 = &stack0xffffffffffffffa0;
    local_10 = dest_00;
    sVar2 = std::char_traits<char>::length((char_type *)0x21b06e);
    fmt_helper::append_string_view(in_stack_ffffffffffffffa8,dest_00);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        auto filename = basename(msg.source.filename);
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(filename, dest);
    }